

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

int __thiscall
gl4cts::GLSL420Pack::Utils::texture::bind(texture *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  RenderContext *pRVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 err;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  
  pRVar1 = this->m_context->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])
                    (pRVar1,CONCAT44(in_register_00000034,__fd),__addr,
                     CONCAT44(in_register_0000000c,__len));
  GVar3 = getTextureTartet(this->m_texture_type);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xb8))(GVar3,this->m_id);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4814);
  return extraout_EAX;
}

Assistant:

void Utils::texture::bind() const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLenum target = getTextureTartet(m_texture_type);

	gl.bindTexture(target, m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}